

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaSimple.c
# Opt level: O0

Vec_Wrd_t * Pla_ManFxMinimize(word *pOn,int nVars)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Vec_Wrd_t *p;
  word *p_00;
  Vec_Int_t *p_01;
  word local_278;
  word Cube;
  int local_268;
  int nDirs_1;
  int pDirs_1 [32];
  int local_1d8;
  int nDirs;
  int pDirs [32];
  Vec_Int_t *vStore;
  int Cubes [32];
  int Count [32];
  word *pDc;
  Vec_Wrd_t *vCubes;
  int nWords;
  int nMints;
  int iVar;
  int iMint;
  int v;
  int i;
  int nVars_local;
  word *pOn_local;
  
  iVar1 = 1 << ((byte)nVars & 0x1f);
  iVar2 = Abc_Bit6WordNum(iVar1);
  p = Vec_WrdAlloc(1000);
  p_00 = (word *)calloc((long)iVar2,8);
  memset(Cubes + 0x1e,0,0x80);
  memset(&vStore,0,0x80);
  p_01 = Vec_IntAlloc(1000);
  iMint = 0;
  do {
    if (iVar1 <= iMint) {
      for (iMint = 0; iMint < iVar1; iMint = iMint + 1) {
        iVar3 = Pla_TtGetBit(pOn,iMint);
        if ((iVar3 != 0) && (iVar3 = Pla_TtGetBit(p_00,iMint), iVar3 == 0)) {
          Cube._4_4_ = Pla_ManExpendDirNum(pOn,nVars,iMint,&local_268);
          iVar = 0;
          while ((iVar < Cube._4_4_ &&
                 ((iVar3 = Pla_TtGetBit(pOn,iMint ^ 1 << ((byte)(&local_268)[iVar] & 0x1f)),
                  iVar3 == 0 ||
                  (iVar3 = Pla_TtGetBit(p_00,iMint ^ 1 << ((byte)(&local_268)[iVar] & 0x1f)),
                  iVar3 != 0))))) {
            iVar = iVar + 1;
          }
          if (iVar == Cube._4_4_) {
            iVar = 0;
          }
          Pla_TtSetBit(p_00,iMint);
          Pla_TtSetBit(p_00,iMint ^ 1 << ((byte)(&local_268)[iVar] & 0x1f));
          Cubes[8] = Cubes[8] + 1;
          Vec_IntPushTwo(p_01,iMint,(&local_268)[iVar]);
        }
      }
      printf("\n");
      uVar4 = Pla_TtCountOnes(pOn,iVar2);
      printf("Truth = %d. ",(ulong)uVar4);
      uVar4 = Pla_TtCountOnes(p_00,iVar2);
      printf("Cover = %d. ",(ulong)uVar4);
      printf("\n");
      printf("Count: ");
      for (iMint = 0; iMint < 0x10; iMint = iMint + 1) {
        if (Cubes[(long)iMint + 0x1e] != 0) {
          printf("%d=%d ",(ulong)(uint)iMint,(ulong)(uint)Cubes[(long)iMint + 0x1e]);
        }
      }
      printf("\n");
      printf("Cubes: ");
      for (iMint = 0; iMint < 0x10; iMint = iMint + 1) {
        if (Cubes[(long)iMint + -2] != 0) {
          printf("%d=%d ",(ulong)(uint)iMint,(ulong)(uint)Cubes[(long)iMint + -2]);
        }
      }
      printf("\n");
      for (iMint = 0; iVar1 = Vec_IntSize(p_01), iMint + 1 < iVar1; iMint = iMint + 2) {
        iVar1 = Vec_IntEntry(p_01,iMint);
        iVar2 = Vec_IntEntry(p_01,iMint + 1);
        local_278 = 0;
        for (iVar = 0; iVar < nVars; iVar = iVar + 1) {
          if (iVar != iVar2) {
            if ((iVar1 >> ((byte)iVar & 0x1f) & 1U) == 0) {
              Pla_CubeSetLit(&local_278,iVar,PLA_LIT_ZERO);
            }
            else {
              Pla_CubeSetLit(&local_278,iVar,PLA_LIT_ONE);
            }
          }
        }
        Vec_WrdPush(p,local_278);
      }
      Vec_IntFree(p_01);
      if (p_00 != (word *)0x0) {
        free(p_00);
      }
      return p;
    }
    iVar3 = Pla_TtGetBit(pOn,iMint);
    if ((iVar3 != 0) && (iVar3 = Pla_TtGetBit(p_00,iMint), iVar3 == 0)) {
      iVar3 = Pla_ManExpendDirNum(pOn,nVars,iMint,&local_1d8);
      Cubes[(long)iVar3 + 0x1e] = Cubes[(long)iVar3 + 0x1e] + 1;
      if (iVar3 == 0) {
        Pla_TtSetBit(p_00,iMint);
        vStore._0_4_ = (int)vStore + 1;
        Vec_IntPushTwo(p_01,iMint,-1);
      }
      else if (iVar3 == 1) {
        Pla_TtSetBit(p_00,iMint);
        Pla_TtSetBit(p_00,iMint ^ 1 << ((byte)local_1d8 & 0x1f));
        vStore._4_4_ = vStore._4_4_ + 1;
        Vec_IntPushTwo(p_01,iMint,local_1d8);
      }
      else if ((iVar3 == 2) &&
              (iVar3 = Pla_TtGetBit(pOn,iMint ^ 1 << ((byte)local_1d8 & 0x1f) ^
                                        1 << ((byte)nDirs & 0x1f)), iVar3 != 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/pla/plaSimple.c"
                      ,0xdb,"Vec_Wrd_t *Pla_ManFxMinimize(word *, int)");
      }
    }
    iMint = iMint + 1;
  } while( true );
}

Assistant:

Vec_Wrd_t * Pla_ManFxMinimize( word * pOn, int nVars )
{
    int i, v, iMint, iVar, nMints = (1 << nVars);
    int nWords = Abc_Bit6WordNum( nMints );
    Vec_Wrd_t * vCubes = Vec_WrdAlloc( 1000 );
    word * pDc = ABC_CALLOC( word, nWords );
    int Count[32] = {0};
    int Cubes[32] = {0};
    Vec_Int_t * vStore = Vec_IntAlloc( 1000 );

    // count the number of expansion directions
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            Count[nDirs]++;
            if ( nDirs == 0 )
            {
                Pla_TtSetBit(pDc, i);
                Cubes[0]++;
                // save
                Vec_IntPushTwo( vStore, i, -1 );
                continue;
            }
            if ( nDirs == 1 )
            {
                //Pla_PrintBinary( (word *)&i, nVars );
                //printf( " %d \n", pDirs[0] );

                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Cubes[1]++;
                // save
                Vec_IntPushTwo( vStore, i, pDirs[0] );
                continue;
            }
            if ( nDirs == 2 && Pla_TtGetBit(pOn, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1])) )
            {
                assert( 0 );
                Pla_TtSetBit(pDc, i);
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[1]));
                Pla_TtSetBit(pDc, i ^ (1 << pDirs[0]) ^ (1 << pDirs[1]));
                Cubes[2]++;
                continue;
            }
        }

    // go through the remaining cubes
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) && !Pla_TtGetBit(pDc, i) )
        {
            int pDirs[32], nDirs = Pla_ManExpendDirNum(pOn, nVars, i, pDirs);
            // find direction, which is not taken
            for ( v = 0; v < nDirs; v++ )
                if ( Pla_TtGetBit(pOn, i ^ (1 << pDirs[v])) && !Pla_TtGetBit(pDc, i ^ (1 << pDirs[v])) )
                    break;
            // if there is no open directions, use any one
            if ( v == nDirs )
                v = 0;
            // mark this one
            Pla_TtSetBit(pDc, i);
            Pla_TtSetBit(pDc, i ^ (1 << pDirs[v]));
            Cubes[10]++;
            // save
            Vec_IntPushTwo( vStore, i, pDirs[v] );
            continue;
        }

    printf( "\n" );
    printf( "Truth = %d. ", Pla_TtCountOnes(pOn, nWords) );
    printf( "Cover = %d. ", Pla_TtCountOnes(pDc, nWords) );
    printf( "\n" );

    printf( "Count: " );
    for ( i = 0; i < 16; i++ )
        if ( Count[i] )
            printf( "%d=%d ", i, Count[i] );
    printf( "\n" );

    printf( "Cubes: " );
    for ( i = 0; i < 16; i++ )
        if ( Cubes[i] )
            printf( "%d=%d ", i, Cubes[i] );
    printf( "\n" );

/*
    // extract cubes one at a time
    for ( i = 0; i < nMints; i++ )
        if ( Pla_TtGetBit(pOn, i) )
        {
            word Cube = 0;
            for ( v = 0; v < nVars; v++ )
                if ( (i >> v) & 1 )
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
                else
                    Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
            Vec_WrdPush( vCubes, Cube );
        }
*/
    Vec_IntForEachEntryDouble( vStore, iMint, iVar, i )
    {
        word Cube = 0;
        for ( v = 0; v < nVars; v++ )
        {
            if ( v == iVar )
                continue;
            if ( (iMint >> v) & 1 )
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ONE );
            else
                Pla_CubeSetLit( &Cube, v, PLA_LIT_ZERO );
        }
        Vec_WrdPush( vCubes, Cube );
    }
    Vec_IntFree( vStore );

    // collect the minterms
    ABC_FREE( pDc );
    return vCubes;
}